

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  bool bVar1;
  uint uVar2;
  uint *in_RSI;
  uint *in_RDI;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar3;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff57;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffc0;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
             (ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
             (ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  bVar1 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  bVar4 = false;
  if (bVar1) {
    uVar3 = *in_RDI;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    bVar4 = uVar3 < uVar2 / *in_RSI;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x133736);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x133740);
  if ((bVar4 & 1) != 0) {
    *in_RDI = *in_RDI * *in_RSI;
    *in_RSI = 1;
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }